

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fInternalFormatQueryTests.cpp
# Opt level: O0

void __thiscall deqp::gles3::Functional::anon_unknown_1::SamplesCase::test(SamplesCase *this)

{
  GLenum GVar1;
  GLsizei bufSize;
  int iVar2;
  unsigned_long uVar3;
  bool bVar4;
  qpTestResult qVar5;
  int *piVar6;
  TestLog *pTVar7;
  MessageBuilder *pMVar8;
  reference pvVar9;
  size_type sVar10;
  MessageBuilder local_678;
  int local_4f8;
  undefined1 local_4f4 [4];
  GLint maximumFormatSampleCount;
  StateQueryMemoryWriteGuard<int> maxSamples;
  MessageBuilder local_4e0;
  MessageBuilder local_360;
  unsigned_long local_1e0;
  size_t ndx;
  int local_1d0;
  GLint sampleCount;
  GLint prevSampleCount;
  vector<int,_std::allocator<int>_> samples;
  MessageBuilder local_1a0;
  undefined1 local_1c [8];
  StateQueryMemoryWriteGuard<int> sampleCounts;
  SamplesCase *this_local;
  
  sampleCounts._4_8_ = this;
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::StateQueryMemoryWriteGuard
            ((StateQueryMemoryWriteGuard<int> *)local_1c);
  GVar1 = this->m_internalFormat;
  piVar6 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::operator&
                     ((StateQueryMemoryWriteGuard<int> *)local_1c);
  glu::CallLogWrapper::glGetInternalformativ
            (&(this->super_ApiCase).super_CallLogWrapper,0x8d41,GVar1,0x9380,1,piVar6);
  ApiCase::expectError(&this->super_ApiCase,0);
  bVar4 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::verifyValidity
                    ((StateQueryMemoryWriteGuard<int> *)local_1c,
                     (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx);
  if (bVar4) {
    pTVar7 = tcu::TestContext::getLog
                       ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx
                       );
    tcu::TestLog::operator<<(&local_1a0,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar8 = tcu::MessageBuilder::operator<<(&local_1a0,(char (*) [21])"// sample counts is ");
    pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(StateQueryMemoryWriteGuard<int> *)local_1c);
    tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1a0);
    piVar6 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::operator_cast_to_int_
                       ((StateQueryMemoryWriteGuard *)local_1c);
    if (*piVar6 != 0) {
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)&prevSampleCount);
      piVar6 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::operator_cast_to_int_
                         ((StateQueryMemoryWriteGuard *)local_1c);
      sampleCount = -1;
      std::vector<int,_std::allocator<int>_>::resize
                ((vector<int,_std::allocator<int>_> *)&prevSampleCount,(long)*piVar6,&sampleCount);
      GVar1 = this->m_internalFormat;
      piVar6 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::operator_cast_to_int_
                         ((StateQueryMemoryWriteGuard *)local_1c);
      bufSize = *piVar6;
      pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)&prevSampleCount,0);
      glu::CallLogWrapper::glGetInternalformativ
                (&(this->super_ApiCase).super_CallLogWrapper,0x8d41,GVar1,0x80a9,bufSize,pvVar9);
      ApiCase::expectError(&this->super_ApiCase,0);
      local_1d0 = 0;
      for (local_1e0 = 0; uVar3 = local_1e0, ndx._4_4_ = local_1d0,
          sVar10 = std::vector<int,_std::allocator<int>_>::size
                             ((vector<int,_std::allocator<int>_> *)&prevSampleCount), uVar3 < sVar10
          ; local_1e0 = local_1e0 + 1) {
        pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)&prevSampleCount,local_1e0);
        ndx._4_4_ = *pvVar9;
        if (ndx._4_4_ < 1) {
          pTVar7 = tcu::TestContext::getLog
                             ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.
                              m_testCtx);
          tcu::TestLog::operator<<(&local_360,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar8 = tcu::MessageBuilder::operator<<
                             (&local_360,
                              (char (*) [57])
                              "// ERROR: Expected sample count to be at least one; got ");
          pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(int *)((long)&ndx + 4));
          tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_360);
          qVar5 = tcu::TestContext::getTestResult
                            ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.
                             m_testCtx);
          if (qVar5 == QP_TEST_RESULT_PASS) {
            tcu::TestContext::setTestResult
                      ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                       QP_TEST_RESULT_FAIL,"got invalid value");
          }
        }
        if ((local_1e0 != 0) && (local_1d0 <= ndx._4_4_)) {
          pTVar7 = tcu::TestContext::getLog
                             ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.
                              m_testCtx);
          tcu::TestLog::operator<<(&local_4e0,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar8 = tcu::MessageBuilder::operator<<
                             (&local_4e0,
                              (char (*) [67])
                              "// ERROR: Expected sample count to be ordered in descending order;");
          pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [5])0x2b870f8);
          pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_1d0);
          pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [11])0x2c04282);
          maxSamples._4_8_ = local_1e0 - 1;
          pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(unsigned_long *)&maxSamples.m_value);
          pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [7])0x2b9a7fa);
          pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(int *)((long)&ndx + 4));
          pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [11])0x2c04282);
          pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_1e0);
          tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_4e0);
          qVar5 = tcu::TestContext::getTestResult
                            ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.
                             m_testCtx);
          if (qVar5 == QP_TEST_RESULT_PASS) {
            tcu::TestContext::setTestResult
                      ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                       QP_TEST_RESULT_FAIL,"got invalid order");
          }
        }
        local_1d0 = ndx._4_4_;
      }
      if ((this->m_isIntegerInternalFormat & 1U) == 0) {
        deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::StateQueryMemoryWriteGuard
                  ((StateQueryMemoryWriteGuard<int> *)local_4f4);
        piVar6 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::operator&
                           ((StateQueryMemoryWriteGuard<int> *)local_4f4);
        glu::CallLogWrapper::glGetIntegerv
                  (&(this->super_ApiCase).super_CallLogWrapper,0x8d57,piVar6);
        ApiCase::expectError(&this->super_ApiCase,0);
        bVar4 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::verifyValidity
                          ((StateQueryMemoryWriteGuard<int> *)local_4f4,
                           (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.
                           m_testCtx);
        if (bVar4) {
          pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)&prevSampleCount,0);
          iVar2 = *pvVar9;
          local_4f8 = iVar2;
          piVar6 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::operator_cast_to_int_
                             ((StateQueryMemoryWriteGuard *)local_4f4);
          if (iVar2 < *piVar6) {
            pTVar7 = tcu::TestContext::getLog
                               ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.
                                m_testCtx);
            tcu::TestLog::operator<<(&local_678,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
            pMVar8 = tcu::MessageBuilder::operator<<
                               (&local_678,
                                (char (*) [46])"// ERROR: Expected maximum value in SAMPLES (");
            pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_4f8);
            pMVar8 = tcu::MessageBuilder::operator<<
                               (pMVar8,(char (*) [44])") to be at least the value of MAX_SAMPLES (")
            ;
            pMVar8 = tcu::MessageBuilder::operator<<
                               (pMVar8,(StateQueryMemoryWriteGuard<int> *)local_4f4);
            pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [2])0x2a85ff4);
            tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
            tcu::MessageBuilder::~MessageBuilder(&local_678);
            qVar5 = tcu::TestContext::getTestResult
                              ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.
                               m_testCtx);
            if (qVar5 == QP_TEST_RESULT_PASS) {
              tcu::TestContext::setTestResult
                        ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.
                         m_testCtx,QP_TEST_RESULT_FAIL,"got invalid maximum sample count");
            }
          }
        }
      }
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)&prevSampleCount);
    }
  }
  return;
}

Assistant:

void test (void)
	{
		using tcu::TestLog;

		StateQueryMemoryWriteGuard<GLint> sampleCounts;
		glGetInternalformativ(GL_RENDERBUFFER, m_internalFormat, GL_NUM_SAMPLE_COUNTS, 1, &sampleCounts);
		expectError(GL_NO_ERROR);

		if (!sampleCounts.verifyValidity(m_testCtx))
			return;

		m_testCtx.getLog() << TestLog::Message << "// sample counts is " << sampleCounts << TestLog::EndMessage;

		if (sampleCounts == 0)
			return;

		std::vector<GLint> samples;
		samples.resize(sampleCounts, -1);
		glGetInternalformativ(GL_RENDERBUFFER, m_internalFormat, GL_SAMPLES, sampleCounts, &samples[0]);
		expectError(GL_NO_ERROR);

		GLint prevSampleCount = 0;
		GLint sampleCount = 0;
		for (size_t ndx = 0; ndx < samples.size(); ++ndx, prevSampleCount = sampleCount)
		{
			sampleCount = samples[ndx];

			// sample count must be > 0
			if (sampleCount <= 0)
			{
				m_testCtx.getLog() << TestLog::Message << "// ERROR: Expected sample count to be at least one; got " << sampleCount << TestLog::EndMessage;
				if (m_testCtx.getTestResult() == QP_TEST_RESULT_PASS)
					m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "got invalid value");
			}

			// samples must be ordered descending
			if (ndx != 0 && !(sampleCount < prevSampleCount))
			{
				m_testCtx.getLog() << TestLog::Message
					<< "// ERROR: Expected sample count to be ordered in descending order;"
					<< "got " << prevSampleCount << " at index " << (ndx - 1) << ", and " << sampleCount << " at index " << ndx << TestLog::EndMessage;
				if (m_testCtx.getTestResult() == QP_TEST_RESULT_PASS)
					m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "got invalid order");
			}
		}

		if (!m_isIntegerInternalFormat)
		{
			// the maximum value in SAMPLES is guaranteed to be at least the value of MAX_SAMPLES
			StateQueryMemoryWriteGuard<GLint> maxSamples;
			glGetIntegerv(GL_MAX_SAMPLES, &maxSamples);
			expectError(GL_NO_ERROR);

			if (maxSamples.verifyValidity(m_testCtx))
			{
				const GLint maximumFormatSampleCount = samples[0];
				if (!(maximumFormatSampleCount >= maxSamples))
				{
					m_testCtx.getLog() << TestLog::Message << "// ERROR: Expected maximum value in SAMPLES (" << maximumFormatSampleCount << ") to be at least the value of MAX_SAMPLES (" << maxSamples << ")" << TestLog::EndMessage;
					if (m_testCtx.getTestResult() == QP_TEST_RESULT_PASS)
						m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "got invalid maximum sample count");
				}
		  }
		}
	}